

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_92e1f6::HandleConcatCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  ulong uVar1;
  allocator<char> local_31;
  string local_30;
  
  uVar1 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"sub-command CONCAT requires at least one argument.",&local_31);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    joinImpl(args,&local_30,1,status->Makefile);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return 0x20 < uVar1;
}

Assistant:

bool HandleConcatCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command CONCAT requires at least one argument.");
    return false;
  }

  return joinImpl(args, std::string(), 1, status.GetMakefile());
}